

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<long>::InternalSwap
          (RepeatedField<long> *this,RepeatedField<long> *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  LogMessage *pLVar3;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  RepeatedField<long> *local_18;
  RepeatedField<long> *other_local;
  RepeatedField<long> *this_local;
  
  local_51 = 0;
  local_18 = other;
  other_local = this;
  if (this == other) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x5b3);
    local_51 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_50,"CHECK failed: this != other: ");
    internal::LogFinisher::operator=(local_65,pLVar3);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  pAVar1 = GetArena(this);
  pAVar2 = GetArena(local_18);
  local_a1 = 0;
  if (pAVar1 != pAVar2) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x5b4);
    local_a1 = 1;
    pLVar3 = internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: GetArena() == other->GetArena(): ");
    internal::LogFinisher::operator=(&local_a2,pLVar3);
  }
  if ((local_a1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a0);
  }
  internal::memswap<16>((char *)this,(char *)local_18);
  return;
}

Assistant:

inline void RepeatedField<Element>::InternalSwap(RepeatedField* other) {
  GOOGLE_DCHECK(this != other);
  GOOGLE_DCHECK(GetArena() == other->GetArena());

  // Swap all fields at once.
  static_assert(std::is_standard_layout<RepeatedField<Element>>::value,
                "offsetof() requires standard layout before c++17");
  internal::memswap<offsetof(RepeatedField, arena_or_elements_) +
                    sizeof(this->arena_or_elements_) -
                    offsetof(RepeatedField, current_size_)>(
      reinterpret_cast<char*>(this) + offsetof(RepeatedField, current_size_),
      reinterpret_cast<char*>(other) + offsetof(RepeatedField, current_size_));
}